

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  int iVar1;
  uint local_88;
  int local_84;
  uint local_80;
  int processingDone;
  DdHalfWord botDist;
  uint pathLength;
  uint evenLen;
  uint oddLen;
  NodeDist_t *nodeStatChild;
  NodeDist_t *nodeStat;
  DdNode *regChild;
  DdNode *child;
  DdNode *realChild;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  FILE *fp_local;
  uint *pathLengthArray_local;
  st__table *pathTable_local;
  DdNode *node_local;
  
  if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
    node_local._4_4_ = 1;
  }
  else {
    Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    N = (DdNode *)fp;
    fp_local = (FILE *)pathLengthArray;
    pathLengthArray_local = (uint *)pathTable;
    pathTable_local = (st__table *)node;
    iVar1 = st__lookup(pathTable,(char *)Nv,(char **)&nodeStatChild);
    if (iVar1 == 0) {
      fprintf((FILE *)N,"Something wrong, the entry doesn\'t exist\n");
      node_local._4_4_ = 0;
    }
    else {
      if ((nodeStatChild->oddTopDist == 0xffffffff) || (nodeStatChild->oddBotDist == 0xffffffff)) {
        pathLength = 0xffffffff;
      }
      else {
        pathLength = nodeStatChild->oddTopDist + nodeStatChild->oddBotDist;
      }
      if ((nodeStatChild->evenTopDist == 0xffffffff) || (nodeStatChild->evenBotDist == 0xffffffff))
      {
        botDist = 0xffffffff;
      }
      else {
        botDist = nodeStatChild->evenTopDist + nodeStatChild->evenBotDist;
      }
      if (botDist < pathLength) {
        local_88 = botDist;
      }
      else {
        local_88 = pathLength;
      }
      processingDone = local_88;
      Nnv = *(DdNode **)(((ulong)Nv & 0xfffffffffffffffe) + 0x10);
      realChild = *(DdNode **)(((ulong)Nv & 0xfffffffffffffffe) + 0x18);
      for (local_84 = 0; local_84 != 2; local_84 = local_84 + 1) {
        if (local_84 == 0) {
          regChild = Nnv;
        }
        else {
          regChild = realChild;
        }
        child = (DdNode *)((ulong)regChild ^ (long)(int)((uint)pathTable_local & 1));
        nodeStat = (NodeDist_t *)((ulong)regChild & 0xfffffffffffffffe);
        if (*(int *)((ulong)child & 0xfffffffffffffffe) == 0x7fffffff) {
          if (((ulong)regChild & 1) == 0) {
            nodeStatChild->evenBotDist = 1;
          }
          else {
            nodeStatChild->oddBotDist = 1;
          }
        }
        else {
          iVar1 = st__lookup((st__table *)pathLengthArray_local,(char *)nodeStat,(char **)&evenLen);
          if (iVar1 == 0) {
            fprintf((FILE *)N,
                    "Something wrong, node in table should have been created in top dist proc.\n");
            return 0;
          }
          if (*(int *)(_evenLen + 8) == -1) {
            if (*(int *)(_evenLen + 0xc) != -1) {
              fprintf((FILE *)N,"Something wrong, both bot nodeStats should be there\n");
              return 0;
            }
            iVar1 = CreateBotDist(child,(st__table *)pathLengthArray_local,(uint *)fp_local,
                                  (FILE *)N);
            if (iVar1 == 0) {
              return 0;
            }
          }
          if (((ulong)regChild & 1) == 0) {
            if (*(int *)(_evenLen + 0xc) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 0xc) + 1;
            }
            if (local_80 < nodeStatChild->evenBotDist) {
              nodeStatChild->evenBotDist = local_80;
            }
            if (*(int *)(_evenLen + 8) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 8) + 1;
            }
            if (local_80 < nodeStatChild->oddBotDist) {
              nodeStatChild->oddBotDist = local_80;
            }
          }
          else {
            if (*(int *)(_evenLen + 8) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 8) + 1;
            }
            if (local_80 < nodeStatChild->evenBotDist) {
              nodeStatChild->evenBotDist = local_80;
            }
            if (*(int *)(_evenLen + 0xc) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 0xc) + 1;
            }
            if (local_80 < nodeStatChild->oddBotDist) {
              nodeStatChild->oddBotDist = local_80;
            }
          }
        }
      }
      if ((nodeStatChild->oddTopDist == 0xffffffff) || (nodeStatChild->oddBotDist == 0xffffffff)) {
        pathLength = 0xffffffff;
      }
      else {
        pathLength = nodeStatChild->oddTopDist + nodeStatChild->oddBotDist;
      }
      if ((nodeStatChild->evenTopDist == 0xffffffff) || (nodeStatChild->evenBotDist == 0xffffffff))
      {
        botDist = 0xffffffff;
      }
      else {
        botDist = nodeStatChild->evenTopDist + nodeStatChild->evenBotDist;
      }
      if (pathLength < local_88) {
        if (local_88 != 0xffffffff) {
          (&fp_local->_flags)[local_88] = (&fp_local->_flags)[local_88] + -1;
        }
        if (pathLength != 0xffffffff) {
          (&fp_local->_flags)[pathLength] = (&fp_local->_flags)[pathLength] + 1;
        }
        processingDone = pathLength;
      }
      if (botDist < (uint)processingDone) {
        if (processingDone != -1) {
          (&fp_local->_flags)[(uint)processingDone] = (&fp_local->_flags)[(uint)processingDone] + -1
          ;
        }
        if (botDist != 0xffffffff) {
          (&fp_local->_flags)[botDist] = (&fp_local->_flags)[botDist] + 1;
        }
      }
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

static NodeStat *
CreateBotDist(
  DdNode * node,
  st__table * distanceTable)
{
    DdNode *N, *Nv, *Nnv;
    int distance, distanceNv, distanceNnv;
    NodeStat *nodeStat, *nodeStatNv, *nodeStatNnv;

#if 0
    if (Cudd_IsConstant(node)) {
        return(0);
    }
#endif
    
    /* Return the entry in the table if found. */
    N = Cudd_Regular(node);
    if ( st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        nodeStat->localRef++;
        return(nodeStat);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    nodeStatNv = CreateBotDist(Nv, distanceTable);
    if (nodeStatNv == NULL) return(NULL);
    distanceNv = nodeStatNv->distance;

    nodeStatNnv = CreateBotDist(Nnv, distanceTable);
    if (nodeStatNnv == NULL) return(NULL);
    distanceNnv = nodeStatNnv->distance;
    /* Store max distance from constant; note sometimes this distance
    ** may be to 0.
    */
    distance = (distanceNv > distanceNnv) ? (distanceNv+1) : (distanceNnv + 1);

    nodeStat = ABC_ALLOC(NodeStat, 1);
    if (nodeStat == NULL) {
        return(0);
    }
    nodeStat->distance = distance;
    nodeStat->localRef = 1;
    
    if ( st__insert(distanceTable, (char *)N, (char *)nodeStat) ==
        st__OUT_OF_MEM) {
        return(0);

    }
    return(nodeStat);

}